

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::handle_read<std::__cxx11::string>
          (coro_http_client *this,error_code *ec,size_t *size,bool *is_keep_alive,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,http_method method)

{
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  bool bVar6;
  coro_http_client *pcVar7;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  size_type sVar8;
  char *pcVar9;
  int64_t iVar10;
  char *pcVar11;
  pointer pcVar12;
  undefined8 *extraout_RAX_02;
  size_t sVar13;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  size_type __len;
  undefined8 *extraout_RAX_06;
  size_t in_RCX;
  http_header *phVar14;
  string_view *psVar15;
  char **ppcVar16;
  char **ppcVar17;
  http_header *phVar18;
  suspend_always *this_00;
  http_header *this_01;
  byte *pbVar19;
  byte *pbVar20;
  http_header *phVar21;
  char **this_02;
  string_view *psVar22;
  char **this_03;
  byte *pbVar23;
  char **ppcVar24;
  http_header *this_04;
  string_view *psVar25;
  char **this_05;
  char **this_06;
  FinalAwaiter *this_07;
  char *in_RDX;
  char *in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  char *in_R8;
  error_code eVar26;
  string_view sVar27;
  mutable_buffer mVar28;
  undefined4 in_stack_00000008;
  char *data_ptr_2;
  char *data_ptr_1;
  char *data_ptr;
  undefined4 in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5ec;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  basic_streambuf<std::allocator<char>_> *in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff60c;
  http_parser *in_stack_fffffffffffff610;
  char *in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff624;
  undefined4 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff62c;
  undefined4 in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  resp_data *in_stack_fffffffffffff668;
  coro_http_client *in_stack_fffffffffffff670;
  int local_980;
  int local_948;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7fc;
  undefined1 is_ranges;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  coro_http_client *in_stack_fffffffffffff810;
  int local_770;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_00;
  resp_data *data;
  coro_http_client *this_08;
  coro_http_client *ctx_01;
  coro_http_client *data_00;
  coro_http_client *this_09;
  basic_string_view<char,_std::char_traits<char>_> local_528 [2];
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_508;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_4b8;
  const_buffer local_468;
  const_buffer local_430;
  char *local_420;
  undefined8 local_418;
  undefined8 local_410;
  string_view local_3f0;
  string_view local_3d0;
  string_view local_3b0;
  string_view local_390 [2];
  string_view local_370;
  size_t *local_358;
  const_buffer local_2e0;
  char *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  size_t *local_2b8;
  const_buffer local_240;
  char *local_230;
  undefined8 local_228;
  undefined8 local_220;
  int local_210;
  undefined4 uStack_20c;
  error_category *local_208;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_200;
  __sv_type local_1d8;
  char *local_80;
  size_t local_78;
  char *local_70;
  
  is_ranges = (undefined1)((uint)in_stack_fffffffffffff7fc >> 0x18);
  local_80 = in_R8;
  local_78 = in_RCX;
  local_70 = in_RDX;
  pcVar7 = (coro_http_client *)operator_new(0x398,(nothrow_t *)&std::nothrow);
  if (pcVar7 == (coro_http_client *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  (pcVar7->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)handle_read<std::__cxx11::string>;
  (((string *)
   &(pcVar7->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount)->
  _M_dataplus)._M_p = (pointer)handle_read<std::__cxx11::string>;
  phVar14 = (pcVar7->parser_).headers_._M_elems + 0xd;
  psVar15 = &(pcVar7->parser_).headers_._M_elems[0xd].value;
  ppcVar16 = &(pcVar7->parser_).headers_._M_elems[0x14].name._M_str;
  ppcVar17 = &(pcVar7->parser_).headers_._M_elems[0x14].value._M_str;
  phVar18 = (pcVar7->parser_).headers_._M_elems + 0x1a;
  this_00 = (suspend_always *)((long)&(pcVar7->parser_).headers_._M_elems[0x1a].name._M_str + 1);
  this_01 = (pcVar7->parser_).headers_._M_elems + 0x15;
  pbVar19 = (byte *)((long)&(pcVar7->parser_).headers_._M_elems[0x1a].name._M_str + 2);
  pbVar20 = (byte *)((long)&(pcVar7->parser_).headers_._M_elems[0x1a].name._M_str + 3);
  phVar21 = (pcVar7->parser_).headers_._M_elems + 0xe;
  this_02 = &(pcVar7->parser_).headers_._M_elems[0x15].value._M_str;
  psVar22 = &(pcVar7->parser_).headers_._M_elems[0xe].value;
  this_03 = &(pcVar7->parser_).headers_._M_elems[0x16].name._M_str;
  pbVar23 = (byte *)((long)&(pcVar7->parser_).headers_._M_elems[0x1a].name._M_str + 4);
  ppcVar24 = &(pcVar7->parser_).headers_._M_elems[0x16].value._M_str;
  this_04 = (pcVar7->parser_).headers_._M_elems + 0x17;
  psVar25 = &(pcVar7->parser_).headers_._M_elems[0x17].value;
  ctx_00 = (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((pcVar7->parser_).headers_._M_elems + 0x18);
  data = (resp_data *)&(pcVar7->parser_).headers_._M_elems[0xb].value;
  this_08 = (coro_http_client *)&(pcVar7->parser_).headers_._M_elems[0x18].name._M_str;
  this_05 = &(pcVar7->parser_).headers_._M_elems[0x18].value._M_str;
  this_06 = &(pcVar7->parser_).headers_._M_elems[0x19].name._M_str;
  this_07 = (FinalAwaiter *)((long)&(pcVar7->parser_).headers_._M_elems[0x1a].name._M_str + 5);
  (pcVar7->parser_).headers_._M_elems[0x19].value._M_str = in_RSI;
  *ppcVar16 = local_70;
  (pcVar7->parser_).headers_._M_elems[0x14].value._M_len = local_78;
  *ppcVar17 = local_80;
  ctx_01 = pcVar7;
  data_00 = pcVar7;
  this_09 = pcVar7;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
              (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  *(undefined4 *)&(phVar18->name)._M_len = in_stack_00000008;
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)&pcVar7->parser_);
  bVar6 = std::suspend_always::await_ready(this_00);
  if (!bVar6) {
    *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 0;
    handle_read(in_stack_fffffffffffff600,
                (void *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume(this_00);
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  *(undefined4 *)&(pcVar7->parser_).headers_._M_elems[9].name._M_str = 0;
  *(undefined1 *)((long)&(pcVar7->parser_).headers_._M_elems[9].name._M_str + 4) = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&(pcVar7->parser_).headers_._M_elems[9].value);
  std::span<cinatra::http_header,_18446744073709551615UL>::span
            ((span<cinatra::http_header,_18446744073709551615UL> *)0x16f7f7);
  (pcVar7->parser_).headers_._M_elems[10].value._M_len = 0;
  local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  sVar27._M_str = in_stack_fffffffffffff618;
  sVar27._M_len = (size_t)in_stack_fffffffffffff610;
  async_read_until<asio::basic_streambuf<std::allocator<char>>>
            ((coro_http_client *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
             in_stack_fffffffffffff600,sVar27);
  async_simple::coro::detail::LazyPromiseBase::
  await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  bVar6 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
          await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)this_01);
  if (!bVar6) {
    *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 1;
    handle_read(in_stack_fffffffffffff610,
                (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    (*(code *)*extraout_RAX)(extraout_RAX);
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  (pcVar7->parser_).headers_._M_elems[0x13].value._M_len = (size_t)this_01;
  async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
  awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
              in_stack_fffffffffffff610);
  std::tie<std::error_code,unsigned_long>
            ((error_code *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  local_200 = std::tuple<std::error_code&,unsigned_long&>::operator=
                        ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffff600,
                         (pair<std::error_code,_unsigned_long> *)
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
  ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x16fa0a);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x16fa17);
  bVar6 = std::error_code::operator_cast_to_bool((error_code *)*ppcVar16);
  if (!bVar6) {
    eVar26 = handle_header(in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                           (http_parser *)
                           CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                           CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_208 = eVar26._M_cat;
    local_210 = eVar26._M_value;
    pcVar11 = *ppcVar16;
    *(ulong *)pcVar11 = CONCAT44(uStack_20c,local_210);
    *(error_category **)(pcVar11 + 8) = local_208;
    bVar6 = std::error_code::operator_cast_to_bool((error_code *)*ppcVar16);
    if (!bVar6) {
      bVar6 = http_parser::keep_alive
                        ((http_parser *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      **ppcVar17 = bVar6;
      if ((int)(phVar18->name)._M_len == 2) {
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>
                  ((LazyPromise<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   (resp_data *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
        local_770 = 3;
        goto LAB_001717a0;
      }
      *pbVar19 = 0;
      bVar6 = http_parser::is_resp_ranges(in_stack_fffffffffffff610);
      *pbVar20 = bVar6;
      if ((*pbVar20 & 1) != 0) {
        **ppcVar17 = '\x01';
      }
      bVar6 = http_parser::is_chunked
                        ((http_parser *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      if (bVar6) {
        pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
        std::span<char,_18446744073709551615UL>::span
                  ((span<char,_18446744073709551615UL> *)0x16fc82);
        *(undefined8 *)(pcVar11 + 0x1008) = local_228;
        *(undefined8 *)(pcVar11 + 0x1010) = local_220;
        **ppcVar17 = '\x01';
        sVar13 = asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
        if (sVar13 != 0) {
          pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
          local_240 = (const_buffer)
                      asio::basic_streambuf<std::allocator<char>_>::data
                                ((basic_streambuf<std::allocator<char>_> *)
                                 CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
          pcVar9 = asio::buffer_cast<char_const*>((const_buffer *)0x16fd0c);
          pcVar11 = *(char **)(pcVar11 + 0xdf0);
          local_230 = pcVar9;
          asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
          std::streambuf::sputn(pcVar11,(long)pcVar9);
          asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
          asio::basic_streambuf<std::allocator<char>_>::consume
                    ((basic_streambuf<std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                     (size_t)in_stack_fffffffffffff618);
        }
        req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                      (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
        handle_chunked<std::__cxx11::string>
                  (this_09,(resp_data *)data_00,
                   (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)ctx_01);
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<std::error_code>>
                  ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                   (Lazy<std::error_code> *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        bVar6 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::await_ready
                          ((LazyAwaiterBase<std::error_code> *)this_02);
        if (!bVar6) {
          *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 2;
          handle_read(in_stack_fffffffffffff610,
                      (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
          return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
        }
        (pcVar7->parser_).headers_._M_elems[0x13].name._M_len = (size_t)this_02;
        eVar26 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::awaitResume
                           ((LazyAwaiterBase<std::error_code> *)
                            CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        *(int *)&(phVar14->name)._M_len = eVar26._M_value;
        (pcVar7->parser_).headers_._M_elems[0xd].name._M_str = (char *)eVar26._M_cat;
        pcVar11 = (pcVar7->parser_).headers_._M_elems[0xd].name._M_str;
        *(int *)&(phVar21->name)._M_len = (int)(phVar14->name)._M_len;
        (pcVar7->parser_).headers_._M_elems[0xe].name._M_str = pcVar11;
        local_2b8 = (size_t *)*ppcVar16;
        *local_2b8 = (phVar21->name)._M_len;
        local_2b8[1] = (size_t)(pcVar7->parser_).headers_._M_elems[0xe].name._M_str;
        local_948 = 0;
        async_simple::coro::detail::LazyBase<std::error_code,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x16fff5);
        async_simple::coro::Lazy<std::error_code>::~Lazy((Lazy<std::error_code> *)0x170002);
        req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        sVar5._M_str = local_370._M_str;
        sVar5._M_len = local_370._M_len;
        sVar4._M_str = local_390[0]._M_str;
        sVar4._M_len = local_390[0]._M_len;
        sVar3._M_str = local_3b0._M_str;
        sVar3._M_len = local_3b0._M_len;
        sVar2._M_str = local_3d0._M_str;
        sVar2._M_len = local_3d0._M_len;
        sVar1._M_str = local_3f0._M_str;
        sVar1._M_len = local_3f0._M_len;
        if (local_948 == 0) {
          local_948 = 4;
          local_3f0 = sVar1;
          local_3d0 = sVar2;
          local_3b0 = sVar3;
          local_390[0] = sVar4;
          local_370 = sVar5;
        }
      }
      else {
        bVar6 = http_parser::is_multipart
                          ((http_parser *)
                           CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        if (bVar6) {
          pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
          std::span<char,_18446744073709551615UL>::span
                    ((span<char,_18446744073709551615UL> *)0x1700c8);
          *(undefined8 *)(pcVar11 + 0x1008) = local_2c8;
          *(undefined8 *)(pcVar11 + 0x1010) = local_2c0;
          **ppcVar17 = '\x01';
          sVar13 = asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
          if (sVar13 != 0) {
            pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
            local_2e0 = (const_buffer)
                        asio::basic_streambuf<std::allocator<char>_>::data
                                  ((basic_streambuf<std::allocator<char>_> *)
                                   CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
            pcVar9 = asio::buffer_cast<char_const*>((const_buffer *)0x170152);
            pcVar11 = *(char **)(pcVar11 + 0xdf0);
            local_2d0 = pcVar9;
            asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
            std::streambuf::sputn(pcVar11,(long)pcVar9);
            asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
            asio::basic_streambuf<std::allocator<char>_>::consume
                      ((basic_streambuf<std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                       (size_t)in_stack_fffffffffffff618);
          }
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                        (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
          handle_multipart<std::__cxx11::string>(this_08,data,ctx_00);
          async_simple::coro::detail::LazyPromiseBase::
          await_transform<async_simple::coro::Lazy<std::error_code>>
                    ((LazyPromiseBase *)
                     CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                     (Lazy<std::error_code> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
          bVar6 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::await_ready
                            ((LazyAwaiterBase<std::error_code> *)this_03);
          if (!bVar6) {
            *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 3;
            handle_read(in_stack_fffffffffffff610,
                        (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
            (*(code *)*extraout_RAX_01)(extraout_RAX_01);
            return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
          }
          (pcVar7->parser_).headers_._M_elems[0x13].name._M_str = (char *)this_03;
          eVar26 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::awaitResume
                             ((LazyAwaiterBase<std::error_code> *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
          *(int *)&psVar15->_M_len = eVar26._M_value;
          (pcVar7->parser_).headers_._M_elems[0xd].value._M_str = (char *)eVar26._M_cat;
          pcVar11 = (pcVar7->parser_).headers_._M_elems[0xd].value._M_str;
          *(int *)&psVar22->_M_len = (int)psVar15->_M_len;
          (pcVar7->parser_).headers_._M_elems[0xe].value._M_str = pcVar11;
          local_358 = (size_t *)*ppcVar16;
          *local_358 = psVar22->_M_len;
          local_358[1] = (size_t)(pcVar7->parser_).headers_._M_elems[0xe].value._M_str;
          async_simple::coro::detail::LazyBase<std::error_code,_false>::ValueAwaiter::~ValueAwaiter
                    ((ValueAwaiter *)0x17043b);
          async_simple::coro::Lazy<std::error_code>::~Lazy((Lazy<std::error_code> *)0x170448);
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
          local_948 = 4;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1704dc);
          bVar6 = http_parser::is_location(in_stack_fffffffffffff610);
          *pbVar23 = bVar6;
          if ((*pbVar23 & 1) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff600
                       ,(char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
            key._M_str._0_4_ = in_stack_fffffffffffff620;
            key._M_len = (size_t)in_stack_fffffffffffff618;
            key._M_str._4_4_ = in_stack_fffffffffffff624;
            local_370 = http_parser::get_header_value(in_stack_fffffffffffff610,key);
            std::__cxx11::string::operator=
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff600,
                     (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          key_00._M_str._0_4_ = in_stack_fffffffffffff620;
          key_00._M_len = (size_t)in_stack_fffffffffffff618;
          key_00._M_str._4_4_ = in_stack_fffffffffffff624;
          local_390[0] = http_parser::get_header_value(in_stack_fffffffffffff610,key_00);
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_390);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
            pcVar11[0x1114] = '\x03';
            pcVar11[0x1115] = '\0';
            pcVar11[0x1116] = '\0';
            pcVar11[0x1117] = '\0';
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff600
                       ,(char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
            key_01._M_str._0_4_ = in_stack_fffffffffffff620;
            key_01._M_len = (size_t)in_stack_fffffffffffff618;
            key_01._M_str._4_4_ = in_stack_fffffffffffff624;
            local_3b0 = http_parser::get_header_value(in_stack_fffffffffffff610,key_01);
            sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff610,
                               (char *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608)
                               ,(size_type)in_stack_fffffffffffff600);
            if (sVar8 == 0xffffffffffffffff) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff600,
                         (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
              key_02._M_str._0_4_ = in_stack_fffffffffffff620;
              key_02._M_len = (size_t)in_stack_fffffffffffff618;
              key_02._M_str._4_4_ = in_stack_fffffffffffff624;
              local_3d0 = http_parser::get_header_value(in_stack_fffffffffffff610,key_02);
              sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffff610,
                                 (char *)CONCAT44(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),
                                 (size_type)in_stack_fffffffffffff600);
              if (sVar8 == 0xffffffffffffffff) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff600,
                           (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
                key_03._M_str._0_4_ = in_stack_fffffffffffff620;
                key_03._M_len = (size_t)in_stack_fffffffffffff618;
                key_03._M_str._4_4_ = in_stack_fffffffffffff624;
                local_3f0 = http_parser::get_header_value(in_stack_fffffffffffff610,key_03);
                sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff610,
                                   (char *)CONCAT44(in_stack_fffffffffffff60c,
                                                    in_stack_fffffffffffff608),
                                   (size_type)in_stack_fffffffffffff600);
                if (sVar8 != 0xffffffffffffffff) {
                  pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
                  pcVar11[0x1114] = '\x02';
                  pcVar11[0x1115] = '\0';
                  pcVar11[0x1116] = '\0';
                  pcVar11[0x1117] = '\0';
                }
              }
              else {
                pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
                pcVar11[0x1114] = '\x01';
                pcVar11[0x1115] = '\0';
                pcVar11[0x1116] = '\0';
                pcVar11[0x1117] = '\0';
              }
            }
            else {
              pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
              pcVar11[0x1114] = '\0';
              pcVar11[0x1115] = '\0';
              pcVar11[0x1116] = '\0';
              pcVar11[0x1117] = '\0';
            }
          }
          pcVar9 = (char *)http_parser::body_len
                                     ((http_parser *)
                                      ((ctx_01->parser_).headers_._M_elems[0x19].value._M_str + 0x10
                                      ));
          pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
          *ppcVar24 = pcVar9;
          iVar10 = http_parser::total_len((http_parser *)(pcVar11 + 0x10));
          *(int64_t *)((ctx_01->parser_).headers_._M_elems[0x19].value._M_str + 0x1128) = iVar10;
          bVar6 = std::span<char,_18446744073709551615UL>::empty
                            ((span<char,_18446744073709551615UL> *)0x1709d0);
          *pbVar19 = (bVar6 ^ 0xffU) & 1;
          if (((*pbVar19 & 1) != 0) && (*ppcVar24 != (char *)0x0)) {
            pcVar11 = (char *)std::span<char,_18446744073709551615UL>::size
                                        ((span<char,_18446744073709551615UL> *)0x170a14);
            if (pcVar11 < *ppcVar24) {
              pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
              std::span<char,_18446744073709551615UL>::span
                        ((span<char,_18446744073709551615UL> *)0x170a45);
              *(undefined8 *)(pcVar11 + 0x1008) = local_418;
              *(undefined8 *)(pcVar11 + 0x1010) = local_410;
              *pbVar19 = 0;
            }
          }
          pcVar11 = *ppcVar24;
          pcVar9 = (char *)asio::basic_streambuf<std::allocator<char>_>::size
                                     (in_stack_fffffffffffff600);
          if (pcVar9 < pcVar11) {
            sVar13 = asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
            psVar25->_M_len = sVar13;
            (pcVar7->parser_).headers_._M_elems[0x17].value._M_str = *ppcVar24 + -psVar25->_M_len;
            local_468 = (const_buffer)
                        asio::basic_streambuf<std::allocator<char>_>::data
                                  ((basic_streambuf<std::allocator<char>_> *)
                                   CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
            pcVar11 = asio::buffer_cast<char_const*>((const_buffer *)0x170ea2);
            *(char **)ctx_00 = pcVar11;
            if ((*pbVar19 & 1) == 0) {
              detail::resize<char>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff600,
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
              pcVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x170f3e);
              memcpy(pcVar11,*(void **)ctx_00,psVar25->_M_len);
            }
            else {
              pcVar12 = std::span<char,_18446744073709551615UL>::data
                                  ((span<char,_18446744073709551615UL> *)
                                   ((ctx_01->parser_).headers_._M_elems[0x19].value._M_str + 0x1008)
                                  );
              memcpy(pcVar12,*(void **)ctx_00,psVar25->_M_len);
            }
            asio::basic_streambuf<std::allocator<char>_>::consume
                      ((basic_streambuf<std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                       (size_t)in_stack_fffffffffffff618);
            if ((*pbVar19 & 1) == 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x171262);
              mVar28 = (mutable_buffer)
                       asio::buffer((void *)CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0),
                                    CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
              *(mutable_buffer *)((pcVar7->parser_).headers_._M_elems + 0x12) = mVar28;
              async_read<asio::mutable_buffers_1>
                        ((coro_http_client *)
                         CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                         (mutable_buffers_1 *)in_stack_fffffffffffff600,
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
              async_simple::coro::detail::LazyPromiseBase::
              await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                         (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              bVar6 = async_simple::coro::detail::
                      LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                                ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                                 this_05);
              if (!bVar6) {
                *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 6;
                handle_read(in_stack_fffffffffffff610,
                            (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
                (*(code *)*extraout_RAX_04)(extraout_RAX_04);
                return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
              }
              (pcVar7->parser_).headers_._M_elems[0x14].name._M_len = (size_t)this_05;
              async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::awaitResume
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         in_stack_fffffffffffff610);
              std::tie<std::error_code,unsigned_long>
                        ((error_code *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)
                         ,(unsigned_long *)
                          CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              local_508 = std::tuple<std::error_code&,unsigned_long&>::operator=
                                    ((tuple<std::error_code_&,_unsigned_long_&> *)
                                     in_stack_fffffffffffff600,
                                     (pair<std::error_code,_unsigned_long> *)
                                     CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
              async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>
              ::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x17142e);
              async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                        ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17143b);
              bVar6 = std::error_code::operator_cast_to_bool((error_code *)*ppcVar16);
              if (!bVar6) goto LAB_0017149d;
              local_980 = 4;
              local_948 = local_980;
            }
            else {
              std::span<char,_18446744073709551615UL>::data
                        ((span<char,_18446744073709551615UL> *)
                         ((ctx_01->parser_).headers_._M_elems[0x19].value._M_str + 0x1008));
              sVar27 = (string_view)
                       asio::buffer((void *)CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0),
                                    CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
              (pcVar7->parser_).headers_._M_elems[0x11].value = sVar27;
              async_read<asio::mutable_buffers_1>
                        ((coro_http_client *)
                         CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                         (mutable_buffers_1 *)in_stack_fffffffffffff600,
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
              async_simple::coro::detail::LazyPromiseBase::
              await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                         (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              bVar6 = async_simple::coro::detail::
                      LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                                ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                                 this_08);
              if (!bVar6) {
                *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 5;
                handle_read(in_stack_fffffffffffff610,
                            (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
                (*(code *)*extraout_RAX_03)(extraout_RAX_03);
                return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
              }
              (pcVar7->parser_).headers_._M_elems[0x13].value._M_str = (char *)this_08;
              async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::awaitResume
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         in_stack_fffffffffffff610);
              std::tie<std::error_code,unsigned_long>
                        ((error_code *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)
                         ,(unsigned_long *)
                          CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              local_4b8 = std::tuple<std::error_code&,unsigned_long&>::operator=
                                    ((tuple<std::error_code_&,_unsigned_long_&> *)
                                     in_stack_fffffffffffff600,
                                     (pair<std::error_code,_unsigned_long> *)
                                     CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
              async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>
              ::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x1711be);
              async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                        ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x1711cb);
              bVar6 = std::error_code::operator_cast_to_bool((error_code *)*ppcVar16);
              if (bVar6) {
                local_980 = 4;
                local_948 = local_980;
              }
              else {
LAB_0017149d:
                handle_entire_content<cinatra::req_context<std::__cxx11::string>>
                          (in_stack_fffffffffffff810,
                           (resp_data *)
                           CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                           CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                           (bool)is_ranges,in_stack_fffffffffffff7f0);
                async_simple::coro::detail::LazyPromiseBase::
                await_transform<async_simple::coro::Lazy<void>>
                          ((LazyPromiseBase *)
                           CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                           (Lazy<void> *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                bVar6 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                                  ((LazyAwaiterBase<void> *)this_06);
                if (!bVar6) {
                  *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 7;
                  handle_read(in_stack_fffffffffffff610,
                              (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))
                  ;
                  (*(code *)*extraout_RAX_05)(extraout_RAX_05);
                  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
                }
                (pcVar7->parser_).headers_._M_elems[0x12].value._M_str = (char *)this_06;
                async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                          ((LazyAwaiterBase<void> *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                          ((ValueAwaiter *)0x171634);
                async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x171641);
                local_980 = 0;
                local_948 = local_980;
              }
            }
          }
          else {
            if (*ppcVar24 != (char *)0x0) {
              local_430 = (const_buffer)
                          asio::basic_streambuf<std::allocator<char>_>::data
                                    ((basic_streambuf<std::allocator<char>_> *)
                                     CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
              local_420 = asio::buffer_cast<char_const*>((const_buffer *)0x170b04);
              if ((*pbVar19 & 1) == 0) {
                detail::resize<char>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff600,
                           CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
                pcVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x170b9a);
                memcpy(pcVar11,local_420,(size_t)*ppcVar24);
              }
              else {
                pcVar12 = std::span<char,_18446744073709551615UL>::data
                                    ((span<char,_18446744073709551615UL> *)
                                     ((ctx_01->parser_).headers_._M_elems[0x19].value._M_str +
                                     0x1008));
                memcpy(pcVar12,local_420,(size_t)*ppcVar24);
              }
              asio::basic_streambuf<std::allocator<char>_>::size(in_stack_fffffffffffff600);
              asio::basic_streambuf<std::allocator<char>_>::consume
                        ((basic_streambuf<std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                         (size_t)in_stack_fffffffffffff618);
            }
            handle_entire_content<cinatra::req_context<std::__cxx11::string>>
                      (in_stack_fffffffffffff810,
                       (resp_data *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),(bool)is_ranges
                       ,in_stack_fffffffffffff7f0);
            async_simple::coro::detail::LazyPromiseBase::
            await_transform<async_simple::coro::Lazy<void>>
                      ((LazyPromiseBase *)
                       CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                       (Lazy<void> *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
            bVar6 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                              ((LazyAwaiterBase<void> *)this_04);
            if (!bVar6) {
              *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 4;
              handle_read(in_stack_fffffffffffff610,
                          (void *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
              (*(code *)*extraout_RAX_02)(extraout_RAX_02);
              return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
            }
            (pcVar7->parser_).headers_._M_elems[0x12].value._M_len = (size_t)this_04;
            async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                      ((LazyAwaiterBase<void> *)
                       CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
            async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                      ((ValueAwaiter *)0x170dc1);
            async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x170dce);
            local_948 = 4;
          }
        }
      }
      if ((local_948 != 0) && (local_770 = local_948, local_948 != 4)) goto LAB_001717a0;
    }
  }
  bVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1716eb);
  if (!bVar6) {
    pcVar11 = (ctx_01->parser_).headers_._M_elems[0x19].value._M_str;
    pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x171713);
    __len = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (pcVar11 + 0xfe8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_528,pcVar9,__len)
    ;
    (pcVar7->parser_).headers_._M_elems[9].value._M_len = local_528[0]._M_len;
    (pcVar7->parser_).headers_._M_elems[9].value._M_str = local_528[0]._M_str;
  }
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
             (resp_data *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  local_770 = 3;
LAB_001717a0:
  if (local_770 == 3) {
    async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)&pcVar7->parser_);
    bVar6 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready(this_07);
    if (!bVar6) {
      (ctx_01->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
      super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      *(undefined1 *)&(ctx_01->parser_).headers_._M_elems[0x1a].name._M_str = 8;
      handle_read(in_stack_fffffffffffff600,
                  (void *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
      (*(code *)*extraout_RAX_06)(extraout_RAX_06);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume(this_07);
    in_stack_fffffffffffff5f4 = 0;
    in_stack_fffffffffffff5f0 = 0;
  }
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
            ((LazyPromise<cinatra::resp_data> *)0x171914);
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  if (ctx_01 != (coro_http_client *)0x0) {
    operator_delete(ctx_01,0x398);
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> handle_read(std::error_code &ec,
                                                  size_t &size,
                                                  bool &is_keep_alive,
                                                  req_context<String> ctx,
                                                  http_method method) {
    resp_data data{};
    do {
      if (std::tie(ec, size) = co_await async_read_until(head_buf_, TWO_CRCF);
          ec) {
        break;
      }

      ec = handle_header(data, parser_, size);
      if (ec) {
        break;
      }

      is_keep_alive = parser_.keep_alive();
      if (method == http_method::HEAD) {
        co_return data;
      }

      bool is_out_buf = false;

      bool is_ranges = parser_.is_resp_ranges();
      if (is_ranges) {
        is_keep_alive = true;
      }
      if (parser_.is_chunked()) {
        out_buf_ = {};
        is_keep_alive = true;
        if (head_buf_.size() > 0) {
          const char *data_ptr =
              asio::buffer_cast<const char *>(head_buf_.data());
          chunked_buf_.sputn(data_ptr, head_buf_.size());
          head_buf_.consume(head_buf_.size());
        }
        ec = co_await handle_chunked(data, std::move(ctx));
        break;
      }

      if (parser_.is_multipart()) {
        out_buf_ = {};
        is_keep_alive = true;
        if (head_buf_.size() > 0) {
          const char *data_ptr =
              asio::buffer_cast<const char *>(head_buf_.data());
          chunked_buf_.sputn(data_ptr, head_buf_.size());
          head_buf_.consume(head_buf_.size());
        }
        ec = co_await handle_multipart(data, std::move(ctx));
        break;
      }

      redirect_uri_.clear();
      bool is_redirect = parser_.is_location();
      if (is_redirect)
        redirect_uri_ = parser_.get_header_value("Location");

      if (!parser_.get_header_value("Content-Encoding").empty()) {
        if (parser_.get_header_value("Content-Encoding").find("gzip") !=
            std::string_view::npos)
          encoding_type_ = content_encoding::gzip;
        else if (parser_.get_header_value("Content-Encoding").find("deflate") !=
                 std::string_view::npos)
          encoding_type_ = content_encoding::deflate;
        else if (parser_.get_header_value("Content-Encoding").find("br") !=
                 std::string_view::npos)
          encoding_type_ = content_encoding::br;
      }
      else {
        encoding_type_ = content_encoding::none;
      }

      size_t content_len = (size_t)parser_.body_len();
#ifdef BENCHMARK_TEST
      total_len_ = parser_.total_len();
#endif

      is_out_buf = !out_buf_.empty();
      if (is_out_buf) {
        if (content_len > 0 && out_buf_.size() < content_len) {
          out_buf_ = {};
          is_out_buf = false;
        }
      }

      if (content_len <= head_buf_.size()) {
        // Now get entire content, additional data will discard.
        // copy body.
        if (content_len > 0) {
          auto data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
          if (is_out_buf) {
            memcpy(out_buf_.data(), data_ptr, content_len);
          }
          else {
            detail::resize(body_, content_len);
            memcpy(body_.data(), data_ptr, content_len);
          }
          head_buf_.consume(head_buf_.size());
        }
        co_await handle_entire_content(data, content_len, is_ranges, ctx);
        break;
      }

      // read left part of content.
      size_t part_size = head_buf_.size();
      size_t size_to_read = content_len - part_size;

      auto data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
      if (is_out_buf) {
        memcpy(out_buf_.data(), data_ptr, part_size);
      }
      else {
        detail::resize(body_, content_len);
        memcpy(body_.data(), data_ptr, part_size);
      }

      head_buf_.consume(part_size);

      if (is_out_buf) {
        if (std::tie(ec, size) = co_await async_read(
                asio::buffer(out_buf_.data() + part_size, size_to_read),
                size_to_read);
            ec) {
          break;
        }
      }
      else {
        if (std::tie(ec, size) = co_await async_read(
                asio::buffer(body_.data() + part_size, size_to_read),
                size_to_read);
            ec) {
          break;
        }
      }

      // Now get entire content, additional data will discard.
      co_await handle_entire_content(data, content_len, is_ranges, ctx);
    } while (0);

    if (!resp_chunk_str_.empty()) {
      data.resp_body =
          std::string_view{resp_chunk_str_.data(), resp_chunk_str_.size()};
    }

    co_return data;
  }